

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void remove_stone_from_lookup(event_path_data evp,int stone_num)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = evp->stone_lookup_table_size;
  uVar1 = 0;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
  }
  while( true ) {
    if (uVar3 == uVar1) {
      return;
    }
    if (evp->stone_lookup_table[uVar1].global_id == stone_num) break;
    uVar1 = uVar1 + 1;
  }
  for (; (long)uVar1 < (long)(int)(uVar2 - 1); uVar1 = uVar1 + 1) {
    evp->stone_lookup_table[uVar1] = evp->stone_lookup_table[uVar1 + 1];
    uVar2 = evp->stone_lookup_table_size;
  }
  return;
}

Assistant:

extern void
remove_stone_from_lookup(event_path_data evp, int stone_num)
{
    int i, stone = -1;
    for (i=0; i < evp->stone_lookup_table_size; i++) {
	if (evp->stone_lookup_table[i].global_id == stone_num) {
	    stone = i;
	    break;
	}
    }
    if (stone == -1) return;
    for (i=stone; i < evp->stone_lookup_table_size-1; i++) {
	evp->stone_lookup_table[i] = evp->stone_lookup_table[i+1];
    }
}